

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrOriginFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      if (ctxt->valueNr < ctxt->valueFrame) {
        xmlXPathErr(ctxt,0x17);
      }
      else if (ctxt->context->origin == (xmlNodePtr)0x0) {
        xmlXPathErr(ctxt,0x10);
      }
      else {
        value = xmlXPtrNewLocationSetNodes(ctxt->context->origin,(xmlNodePtr)0x0);
        valuePush(ctxt,value);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

static void
xmlXPtrOriginFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);

    if (ctxt->context->origin == NULL)
	XP_ERROR(XPTR_SYNTAX_ERROR);

    valuePush(ctxt, xmlXPtrNewLocationSetNodes(ctxt->context->origin, NULL));
}